

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint64_Test::TestBody::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,uint64_t value,int varint_length)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  long local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  char *r;
  uint64_t parsed;
  char *cbuffer;
  AssertHelper local_68 [3];
  Message local_50;
  long local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  uint8_t *p;
  uint8_t buffer [10];
  int varint_length_local;
  uint64_t value_local;
  anon_class_1_0_00000001 *this_local;
  
  buffer._2_4_ = varint_length;
  unique0x100004a4 = value;
  memset((void *)((long)&p + 2),0,10);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )io::CodedOutputStream::WriteVarint64ToArray
                   (stack0xffffffffffffffe8,(uint8_t *)((long)&p + 2));
  local_48 = (long)gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl - ((long)&p + 2);
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_40,"p - buffer","varint_length",&local_48,(int *)(buffer + 2));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pMVar2 = testing::Message::operator<<(&local_50,(char (*) [9])"Value = ");
    pMVar2 = testing::Message::operator<<(pMVar2,(unsigned_long *)(buffer + 6));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=(local_68,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    testing::Message::~Message(&local_50);
  }
  cbuffer._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (cbuffer._4_4_ == 0) {
    parsed = (long)&p + 2;
    r = (char *)(stack0xffffffffffffffe8 ^ 0xffffffffffffffff);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )internal::VarintParse<unsigned_long>((char *)parsed,(unsigned_long *)&r);
    local_a0 = (long)gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl - parsed;
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((EqHelper *)local_98,"r - cbuffer","varint_length",&local_a0,(int *)(buffer + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pMVar2 = testing::Message::operator<<(&local_a8,(char (*) [9])"Value = ");
      pMVar2 = testing::Message::operator<<(pMVar2,(unsigned_long *)(buffer + 6));
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x92,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a8);
    }
    cbuffer._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (cbuffer._4_4_ == 0) {
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_c0,"parsed","value",(unsigned_long *)&r,
                 (unsigned_long *)(buffer + 6));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
      if (!bVar1) {
        testing::Message::Message(&local_c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                   ,0x93,pcVar3);
        testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        testing::Message::~Message(&local_c8);
      }
      cbuffer._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    }
  }
  return;
}

Assistant:

TEST(ParseVarintTest, Varint64) {
  auto test_value = [](uint64_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint64ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint64_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint64_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 10; ++varint_length) {
    uint64_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint64_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint64_t>::max(), 10);
}